

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O2

FileInfoWrapper<ASDCP::JP2K::MXFSReader,_MyStereoPictureDescriptor> * __thiscall
FileInfoWrapper<ASDCP::JP2K::MXFSReader,_MyStereoPictureDescriptor>::file_info
          (FileInfoWrapper<ASDCP::JP2K::MXFSReader,_MyStereoPictureDescriptor> *this,
          CommandOptions *Options,char *type_string,IFileReaderFactory *fileReaderFactory,
          FILE *stream)

{
  MXFSReader Reader;
  WriterInfo WI;
  MyStereoPictureDescriptor Desc;
  allocator<char> local_331;
  undefined1 local_330 [16];
  WriterInfo local_320;
  undefined1 local_270 [104];
  PictureDescriptor local_208;
  
  if (type_string != (char *)0x0) {
    if (stream == (FILE *)0x0) {
      stream = (FILE *)_stdout;
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    if ((Options->verbose_flag != false) || (Options->showheader_flag == true)) {
      ASDCP::JP2K::MXFSReader::MXFSReader((MXFSReader *)local_330,fileReaderFactory);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_330 + 0x10),Options->filenames[0],&local_331);
      ASDCP::JP2K::MXFSReader::OpenRead((string *)(local_270 + 0x68));
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)(local_270 + 0x68));
      Kumu::Result_t::~Result_t((Result_t *)(local_270 + 0x68));
      std::__cxx11::string::~string((string *)(local_330 + 0x10));
      if (*(int *)this < 0) {
        if ((*(int *)this == ASDCP::RESULT_FORMAT) && (Options->showheader_flag == true)) {
          ASDCP::JP2K::MXFSReader::DumpHeaderMetadata((_IO_FILE *)local_330);
        }
      }
      else {
        fprintf(_stdout,"File essence type is %s.\n",type_string);
        if (Options->showheader_flag == true) {
          ASDCP::JP2K::MXFSReader::DumpHeaderMetadata((_IO_FILE *)local_330);
        }
        ASDCP::WriterInfo::WriterInfo((WriterInfo *)(local_330 + 0x10));
        ASDCP::JP2K::MXFSReader::FillWriterInfo((WriterInfo *)local_270);
        Kumu::Result_t::~Result_t((Result_t *)local_270);
        ASDCP::WriterInfoDump((WriterInfo *)(local_330 + 0x10),(_IO_FILE *)stream);
        local_208.EditRate = (Rational)0x0;
        local_208.SampleRate = (Rational)0x0;
        local_208.AspectRatio = (Rational)0x0;
        MyStereoPictureDescriptor::FillDescriptor
                  ((MyStereoPictureDescriptor *)(local_270 + 0x68),(MXFSReader *)local_330);
        ASDCP::JP2K::PictureDescriptorDump
                  ((PictureDescriptor *)(local_270 + 0x68),(_IO_FILE *)stream);
        if (Options->showindex_flag == true) {
          ASDCP::JP2K::MXFSReader::DumpIndex((_IO_FILE *)local_330);
        }
        ASDCP::WriterInfo::~WriterInfo((WriterInfo *)(local_330 + 0x10));
      }
      ASDCP::JP2K::MXFSReader::~MXFSReader((MXFSReader *)local_330);
    }
    return this;
  }
  __assert_fail("type_string",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/asdcp-test.cpp"
                ,0x6f0,
                "static Result_t FileInfoWrapper<ASDCP::JP2K::MXFSReader, MyStereoPictureDescriptor>::file_info(CommandOptions &, const char *, const Kumu::IFileReaderFactory &, FILE *) [ReaderT = ASDCP::JP2K::MXFSReader, DescriptorT = MyStereoPictureDescriptor]"
               );
}

Assistant:

static Result_t
  file_info(CommandOptions& Options, const char* type_string, const Kumu::IFileReaderFactory& fileReaderFactory, FILE* stream = 0)
  {
    assert(type_string);
    if ( stream == 0 )
      stream = stdout;

    Result_t result = RESULT_OK;

    if ( Options.verbose_flag || Options.showheader_flag )
      {
	ReaderT     Reader(fileReaderFactory);
	result = Reader.OpenRead(Options.filenames[0]);

	if ( ASDCP_SUCCESS(result) )
	  {
	    fprintf(stdout, "File essence type is %s.\n", type_string);

	    if ( Options.showheader_flag )
	      Reader.DumpHeaderMetadata(stream);

	    WriterInfo WI;
	    Reader.FillWriterInfo(WI);
	    WriterInfoDump(WI, stream);

	    DescriptorT Desc;
	    Desc.FillDescriptor(Reader);
	    Desc.Dump(stream);

	    if ( Options.showindex_flag )
	      Reader.DumpIndex(stream);
	  }
	else if ( result == RESULT_FORMAT && Options.showheader_flag )
	  {
	    Reader.DumpHeaderMetadata(stream);
	  }
      }

    return result;
  }